

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell::
~TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell *this_local;
  
  ~TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNew)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char[100];
    CHECK(cpputestHasCrashed);
    delete [] memory;
    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}